

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::
FeaturesTest_NoNamingStyleViolationsWithPoolOptInIfMessagesAreGood_Test::
~FeaturesTest_NoNamingStyleViolationsWithPoolOptInIfMessagesAreGood_Test
          (FeaturesTest_NoNamingStyleViolationsWithPoolOptInIfMessagesAreGood_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, NoNamingStyleViolationsWithPoolOptInIfMessagesAreGood) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  // Proto2 will have the name enforcement feature off.
  ASSERT_THAT(ParseAndBuildFile("naming1.proto", R"schema(
    syntax = "proto2";
    package naming1;
    message bad_message_name {}
  )schema"),
              NotNull());

  // Edition 2024 with good names.
  ASSERT_THAT(ParseAndBuildFile("naming2.proto", R"schema(
    edition = "2024";
    package naming2.good_package;
    message GoodMessageName { int32 good_field_name = 1; }
    enum GoodEnumName { GOOD_ENUM_VALUE = 0; }
    service GoodServiceName {
      rpc GoodMethodName(GoodMessageName) returns (GoodMessageName) {}
    }
  )schema"),
              NotNull());

  // Edition 2024 with bad names but out-out feature.
  ASSERT_THAT(ParseAndBuildFile("naming3.proto", R"schema(
    edition = "2024";
    package naming3;
    option features.enforce_naming_style = STYLE_LEGACY;
    message bad_message { oneof BadOneof { int32 BadFieldName = 1;  } }
    enum _bad_enum_ { bAd_eNuM_vAlUE = 0; }
    service BadServiceName__1 {
      rpc BadMethodName(bad_message) returns (bad_message) {}
    }
  )schema"),
              NotNull());
}